

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

char * resole_appdir_path(char *root_env_file_path)

{
  char *pcVar1;
  char *idx;
  char *appdir;
  char *root_env_file_path_local;
  
  idx = getenv("APPDIR");
  if (idx == (char *)0x0) {
    if (root_env_file_path == (char *)0x0) {
      fprintf(_stderr,"APPRUN ERROR: Could not resolve APPDIR\n");
      exit(1);
    }
    pcVar1 = strrchr(root_env_file_path,0x2f);
    idx = strndup(root_env_file_path,(long)pcVar1 - (long)root_env_file_path);
  }
  return idx;
}

Assistant:

char *resole_appdir_path(const char *root_env_file_path) {
    char *appdir = getenv("APPDIR");
    if (appdir == NULL) {
        if (root_env_file_path != NULL) {
            char *idx = strrchr(root_env_file_path, '/');
            appdir = strndup(root_env_file_path, idx - root_env_file_path);
        } else {
            die("Could not resolve APPDIR\n");
        }
    }
    return appdir;
}